

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::DiskInterfaceTestStatBadPath::DiskInterfaceTestStatBadPath
          (DiskInterfaceTestStatBadPath *this)

{
  DiskInterfaceTestStatBadPath *this_local;
  
  DiskInterfaceTest::DiskInterfaceTest(&this->super_DiskInterfaceTest);
  (this->super_DiskInterfaceTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskInterfaceTestStatBadPath_00261c98;
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}